

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

string * __thiscall
t_rs_generator::service_call_args_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc)

{
  size_type *psVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  undefined8 uVar4;
  string local_58;
  string local_38;
  
  rust_camel_case(&local_38,this,&(this->super_t_generator).service_name_);
  iVar2 = (*(tfunc->arglist_->super_t_type).super_t_doc._vptr_t_doc[3])();
  rust_camel_case(&local_58,this,(string *)CONCAT44(extraout_var,iVar2));
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    uVar4 = local_38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_58._M_string_length + local_38._M_string_length) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar4 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_38._M_string_length <= (ulong)uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_58,0,(char *)0x0,(ulong)local_38._M_dataplus._M_p);
      goto LAB_00340270;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
LAB_00340270:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::service_call_args_struct_name(t_function* tfunc) {
  // Thrift automatically appends `Args` to the arglist name. No need to do it here.
  return rust_camel_case(service_name_) + rust_camel_case(tfunc->get_arglist()->get_name());
}